

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.cpp
# Opt level: O3

int64_t npas4::GetRAMVirtualUsed(void)

{
  sysinfo memInfo;
  sysinfo sStack_78;
  
  sysinfo(&sStack_78);
  return (ulong)sStack_78.mem_unit * (sStack_78.totalswap - sStack_78.freeswap);
}

Assistant:

int64_t npas4::GetRAMVirtualUsed()
{
#ifdef WIN32
	return npas4::GetRAMVirtualTotal() - npas4::GetRAMVirtualAvailable();
#else
	struct sysinfo memInfo;
	sysinfo(&memInfo);
	const int64_t total = memInfo.totalswap - memInfo.freeswap;
	return total * static_cast<int64_t>(memInfo.mem_unit);
#endif
}